

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void mainmenu(void)

{
  long lVar1;
  WINDOW *pWVar2;
  long lVar3;
  int iVar4;
  wchar_t wVar5;
  undefined8 *puVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  nh_bool tutorial;
  long lVar10;
  char **ppcVar11;
  wchar_t menuresult [1];
  char verstr [32];
  
  puVar6 = (undefined8 *)nh_get_copyright_banner();
  sprintf(verstr,"Version %d.%d.%d",0,0,1);
  do {
    ppcVar11 = nhlogo_ascii;
    if (settings.graphics == 1) {
      ppcVar11 = nhlogo_unicode;
    }
    iVar4 = 0x4a;
    if (settings.graphics != 1) {
      sVar7 = strlen(nhlogo_ascii[0]);
      iVar4 = (int)sVar7;
    }
    lVar10 = -1;
    lVar3 = 0;
    do {
      lVar8 = lVar3;
      lVar1 = lVar10 + 1;
      lVar10 = lVar10 + 1;
      lVar3 = lVar8 + 1;
    } while (ppcVar11[lVar1] != (char *)0x0);
    wclear(basewin);
    wattr_on(basewin,0x200400,0);
    if (lVar10 != 0) {
      uVar9 = 0;
      do {
        wmove(basewin,uVar9 & 0xffffffff,(_COLS - iVar4) / 2);
        waddnstr(basewin,ppcVar11[uVar9],0xffffffff);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    wattr_off(basewin,0x200400,0);
    iVar4 = wmove(basewin,_LINES + -4,0);
    if (iVar4 != -1) {
      waddnstr(basewin,*puVar6,0xffffffff);
    }
    iVar4 = wmove(basewin,_LINES + -3,0);
    if (iVar4 != -1) {
      waddnstr(basewin,puVar6[1],0xffffffff);
    }
    iVar4 = wmove(basewin,_LINES + -2,0);
    if (iVar4 != -1) {
      waddnstr(basewin,puVar6[2],0xffffffff);
    }
    iVar4 = wmove(basewin,_LINES + -1,0);
    if (iVar4 != -1) {
      waddnstr(basewin,puVar6[3],0xffffffff);
    }
    wVar5 = _COLS;
    pWVar2 = basewin;
    iVar4 = _LINES + -2;
    sVar7 = strlen(verstr);
    iVar4 = wmove(pWVar2,iVar4,wVar5 - (int)sVar7);
    if (iVar4 != -1) {
      waddnstr(basewin,verstr,0xffffffff);
    }
    wrefresh(basewin);
    wVar5 = curses_display_menu_core
                      ((nh_menuitem_conflict *)mainmenu_items,L'\a',(char *)0x0,L'\x01',menuresult,
                       L'\0',(wchar_t)lVar10,_COLS,L'\x18',(_func_nh_bool_win_menu_ptr_wchar_t *)0x0
                       ,'\0');
    if (wVar5 < L'\x01') goto switchD_00108465_caseD_7;
    switch(menuresult[0]) {
    case L'\x01':
      tutorial = '\0';
      goto LAB_0010848a;
    case L'\x02':
      tutorial = '\x01';
LAB_0010848a:
      rungame(tutorial);
      break;
    case L'\x03':
      loadgame();
      break;
    case L'\x04':
      replay();
      break;
    case L'\x05':
      display_options('\x01');
      break;
    case L'\x06':
      show_topten((char *)0x0,L'\xffffffff',L'\0','\0');
      break;
    case L'\b':
      goto switchD_00108465_caseD_8;
    }
switchD_00108465_caseD_7:
  } while (L'\xffffffff' < wVar5);
switchD_00108465_caseD_8:
  return;
}

Assistant:

static void mainmenu(void)
{
    int menuresult[1];
    int n = 1, logowidth, logoheight, i;
    const char * const *copybanner = nh_get_copyright_banner();
    const char * const *nhlogo;
    char verstr[32];
    sprintf(verstr, "Version %d.%d.%d", VERSION_MAJOR, VERSION_MINOR, PATCHLEVEL);

    while (n >= 0) {
        nhlogo = (settings.graphics == UNICODE_GRAPHICS) ? nhlogo_unicode : nhlogo_ascii;

        /* strlen doesn't work because there's unicode. */
        logowidth = (settings.graphics == UNICODE_GRAPHICS) ? 74 : strlen(nhlogo_ascii[0]);

        for (logoheight = 0; nhlogo[logoheight]; logoheight++)
            /* empty */;
        wclear(basewin);
        wattron(basewin, A_BOLD | COLOR_PAIR(4));
        for (i = 0; i < logoheight; i++) {
            wmove(basewin, i, (COLS - logowidth) / 2);
            waddstr(basewin, nhlogo[i]);
        }
        wattroff(basewin, A_BOLD | COLOR_PAIR(4));
        mvwaddstr(basewin, LINES-4, 0, copybanner[0]);
        mvwaddstr(basewin, LINES-3, 0, copybanner[1]);
        mvwaddstr(basewin, LINES-2, 0, copybanner[2]);
        mvwaddstr(basewin, LINES-1, 0, copybanner[3]);
        mvwaddstr(basewin, LINES-2, COLS - strlen(verstr), verstr);
        wrefresh(basewin);

        n = curses_display_menu_core(mainmenu_items, ARRAY_SIZE(mainmenu_items),
                NULL, PICK_ONE, menuresult, 0, logoheight,
                COLS, ROWNO+3, NULL, FALSE);
        if (n < 1)
            continue;

        switch (menuresult[0]) {
            case NEWGAME:
                rungame(FALSE);
                break;

            case TUTORIAL:
                rungame(TRUE);
                break;

            case LOAD:
                loadgame();
                break;

            case REPLAY:
                replay();
                break;

            case OPTIONS:
                display_options(TRUE);
                break;

#if defined(NETCLIENT)
            case NETWORK:
                netgame();
                break;
#endif

            case TOPTEN:
                show_topten(NULL, -1, FALSE, FALSE);
                break;

            case EXITGAME:
                n = -1; /* simulate menu cancel */
                return;
        }
    }
}